

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O0

void SelectiveBranchingMT::initialize(search *sch,size_t *param_2,options_i *options)

{
  typed_option<unsigned_long> *this;
  task_data *data;
  undefined8 *in_RDX;
  search *in_RDI;
  task_data *d;
  option_group_definition new_options;
  size_t kbest;
  size_t max_branches;
  string *in_stack_fffffffffffffd28;
  typed_option<unsigned_long> *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  allocator *paVar1;
  typed_option<unsigned_long> *in_stack_fffffffffffffd40;
  typed_option<unsigned_long> *op;
  option_group_definition *in_stack_fffffffffffffd80;
  allocator local_271;
  size_t in_stack_fffffffffffffd90;
  size_t in_stack_fffffffffffffd98;
  task_data *in_stack_fffffffffffffda0;
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [215];
  undefined1 local_81 [33];
  undefined1 local_60 [56];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  search *local_8;
  
  local_20 = 2;
  local_28 = 0;
  op = (typed_option<unsigned_long> *)local_81;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_81 + 1),"selective branching options",(allocator *)op);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::__cxx11::string::~string((string *)(local_81 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"search_max_branch",&local_159);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffd38,(unsigned_long *)in_stack_fffffffffffffd30);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"maximum number of branches to consider",&local_181);
  VW::config::typed_option<unsigned_long>::help(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28)
  ;
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffffd80,op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"search_kbest",&local_249);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffd38,(unsigned_long *)in_stack_fffffffffffffd30);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
  paVar1 = &local_271;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffd90,
             "number of best items to output (0=just like non-selectional-branching, default)",
             paVar1);
  this = VW::config::typed_option<unsigned_long>::help
                   (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffffd80,op);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd90);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_long>::~typed_option(this);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_18)(local_18,local_60);
  data = (task_data *)operator_new(0x90);
  task_data::task_data
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  Search::search::set_metatask_data<SelectiveBranchingMT::task_data>(local_8,data);
  VW::config::option_group_definition::~option_group_definition((option_group_definition *)this);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  size_t max_branches = 2;
  size_t kbest = 0;
  option_group_definition new_options("selective branching options");
  new_options
      .add(make_option("search_max_branch", max_branches)
               .default_value(2)
               .help("maximum number of branches to consider"))
      .add(make_option("search_kbest", kbest)
               .default_value(0)
               .help("number of best items to output (0=just like non-selectional-branching, default)"));
  options.add_and_parse(new_options);

  task_data* d = new task_data(max_branches, kbest);
  sch.set_metatask_data(d);
}